

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::WriteToShardStatusFileIfNeeded(void)

{
  char *path;
  FILE *__stream;
  FILE *file;
  char *test_shard_file;
  
  path = posix::GetEnv("GTEST_SHARD_STATUS_FILE");
  if (path != (char *)0x0) {
    __stream = (FILE *)posix::FOpen(path,"w");
    if (__stream == (FILE *)0x0) {
      ColoredPrintf(COLOR_RED,
                    "Could not write to the test shard status file \"%s\" specified by the %s environment variable.\n"
                    ,path,"GTEST_SHARD_STATUS_FILE");
      fflush(_stdout);
      exit(1);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void WriteToShardStatusFileIfNeeded() {
  const char* const test_shard_file = posix::GetEnv(kTestShardStatusFile);
  if (test_shard_file != NULL) {
    FILE* const file = posix::FOpen(test_shard_file, "w");
    if (file == NULL) {
      ColoredPrintf(COLOR_RED,
                    "Could not write to the test shard status file \"%s\" "
                    "specified by the %s environment variable.\n",
                    test_shard_file, kTestShardStatusFile);
      fflush(stdout);
      exit(EXIT_FAILURE);
    }
    fclose(file);
  }
}